

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall
GibbsSamplerFromHDP::writeParameters
          (GibbsSamplerFromHDP *this,string *thetaFilename,string *phiFilename)

{
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)thetaFilename);
  outputVector<double>(&this->_thetaEx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)phiFilename);
  outputVector<double>(&this->_phiEx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void GibbsSamplerFromHDP::writeParameters(string thetaFilename, string phiFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
}